

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O1

from_chars_result __thiscall
semver::detail::version_parser::parse<int,int,int>(version_parser *this,version<int,_int,_int> *out)

{
  token_type tVar1;
  from_chars_result fVar2;
  from_chars_result fVar3;
  from_chars_result fVar4;
  bool bVar5;
  byte *pbVar6;
  size_t sVar7;
  token_stream *ptVar8;
  char *pcVar9;
  undefined8 uVar10;
  pointer ptVar11;
  pointer ptVar12;
  pointer ptVar15;
  ulong uVar16;
  from_chars_result fVar17;
  token local_38;
  pointer ptVar13;
  pointer ptVar14;
  
  ptVar12 = &local_38;
  ptVar13 = &local_38;
  ptVar14 = &local_38;
  out->major_ = 0;
  out->minor_ = 1;
  out->patch_ = 0;
  bVar5 = false;
  (out->prerelease_tag_)._M_string_length = 0;
  *(out->prerelease_tag_)._M_dataplus._M_p = '\0';
  std::
  vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ::_M_erase_at_end(&out->prerelease_identifiers,
                    (out->prerelease_identifiers).
                    super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  (out->build_metadata_)._M_string_length = 0;
  *(out->build_metadata_)._M_dataplus._M_p = '\0';
  ptVar8 = this->stream;
  sVar7 = ptVar8->current;
  ptVar15 = (ptVar8->tokens).
            super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ptVar11 = ptVar15 + sVar7;
  local_38.type = ptVar11->type;
  local_38.value.
  super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
       = (ptVar11->value).
         super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>;
  local_38._3_5_ = *(undefined5 *)&ptVar11->field_0x3;
  local_38.lexeme = ptVar15[sVar7].lexeme;
  ptVar8->current = sVar7 + 1;
  uVar10 = 0x16;
  if (local_38.type == digit) {
    pbVar6 = std::get<1UL,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                       (&local_38.value);
    uVar16 = (ulong)*pbVar6;
    if (uVar16 == 0) {
      out->major_ = (uint)*pbVar6;
      ptVar8 = this->stream;
LAB_0015e04e:
      ptVar12 = (ptVar8->tokens).
                super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
                _M_impl.super__Vector_impl_data._M_start + ptVar8->current;
      uVar10 = 0;
      bVar5 = true;
    }
    else {
      ptVar8 = this->stream;
      sVar7 = ptVar8->current;
      ptVar15 = (ptVar8->tokens).
                super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ptVar11 = ptVar15 + sVar7;
      local_38.type = ptVar11->type;
      local_38.value.
      super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
           = (ptVar11->value).
             super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
      ;
      local_38._3_5_ = *(undefined5 *)&ptVar11->field_0x3;
      if (local_38.type == digit) {
        ptVar15 = ptVar15 + sVar7;
        do {
          local_38.lexeme = ptVar15->lexeme;
          ptVar8->current = sVar7 + 1;
          pbVar6 = std::
                   get<1UL,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                             (&local_38.value);
          uVar16 = (ulong)*pbVar6 + uVar16 * 10;
          ptVar8 = this->stream;
          sVar7 = ptVar8->current;
          ptVar11 = (ptVar8->tokens).
                    super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ptVar15 = ptVar11 + sVar7;
          ptVar11 = ptVar11 + sVar7;
          local_38.type = ptVar11->type;
          local_38.value.
          super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
          super__Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
          .
          super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
          .
          super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
          .
          super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
          .
          super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
               = (ptVar11->value).
                 super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
          ;
          local_38._3_5_ = *(undefined5 *)&ptVar11->field_0x3;
        } while (local_38.type == digit);
      }
      if (uVar16 < 0x80000000) {
        out->major_ = (int)uVar16;
        goto LAB_0015e04e;
      }
      uVar10 = 0x22;
      bVar5 = false;
    }
    local_38.lexeme = ptVar12->lexeme;
  }
  fVar2._8_8_ = uVar10;
  fVar2.ptr = local_38.lexeme;
  if (!bVar5) {
    return (from_chars_result)fVar2;
  }
  ptVar8 = this->stream;
  ptVar11 = (ptVar8->tokens).
            super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
            _M_impl.super__Vector_impl_data._M_start;
  tVar1 = ptVar11[ptVar8->current].type;
  sVar7 = ptVar8->current + 1;
  ptVar8->current = sVar7;
  if (tVar1 != dot) goto LAB_0015e28b;
  sVar7 = ptVar8->current;
  ptVar15 = (ptVar8->tokens).
            super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ptVar11 = ptVar15 + sVar7;
  local_38.type = ptVar11->type;
  local_38.value.
  super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
       = (ptVar11->value).
         super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>;
  local_38._3_5_ = *(undefined5 *)&ptVar11->field_0x3;
  local_38.lexeme = ptVar15[sVar7].lexeme;
  ptVar8->current = sVar7 + 1;
  if (local_38.type == digit) {
    pbVar6 = std::get<1UL,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                       (&local_38.value);
    uVar16 = (ulong)*pbVar6;
    if (uVar16 == 0) {
      out->minor_ = (uint)*pbVar6;
      ptVar8 = this->stream;
LAB_0015e176:
      ptVar13 = (ptVar8->tokens).
                super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
                _M_impl.super__Vector_impl_data._M_start + ptVar8->current;
      uVar10 = 0;
      bVar5 = true;
    }
    else {
      ptVar8 = this->stream;
      sVar7 = ptVar8->current;
      ptVar15 = (ptVar8->tokens).
                super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ptVar11 = ptVar15 + sVar7;
      local_38.type = ptVar11->type;
      local_38.value.
      super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
      super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
           = (ptVar11->value).
             super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
      ;
      local_38._3_5_ = *(undefined5 *)&ptVar11->field_0x3;
      if (local_38.type == digit) {
        ptVar15 = ptVar15 + sVar7;
        do {
          local_38.lexeme = ptVar15->lexeme;
          ptVar8->current = sVar7 + 1;
          pbVar6 = std::
                   get<1UL,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                             (&local_38.value);
          uVar16 = (ulong)*pbVar6 + uVar16 * 10;
          ptVar8 = this->stream;
          sVar7 = ptVar8->current;
          ptVar11 = (ptVar8->tokens).
                    super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ptVar15 = ptVar11 + sVar7;
          ptVar11 = ptVar11 + sVar7;
          local_38.type = ptVar11->type;
          local_38.value.
          super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
          super__Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
          .
          super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
          .
          super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
          .
          super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
          .
          super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
               = (ptVar11->value).
                 super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
          ;
          local_38._3_5_ = *(undefined5 *)&ptVar11->field_0x3;
        } while (local_38.type == digit);
      }
      if (uVar16 < 0x80000000) {
        out->minor_ = (int)uVar16;
        goto LAB_0015e176;
      }
      uVar10 = 0x22;
      bVar5 = false;
    }
    local_38.lexeme = ptVar13->lexeme;
  }
  else {
    uVar10 = 0x16;
    bVar5 = false;
  }
  fVar3._8_8_ = uVar10;
  fVar3.ptr = local_38.lexeme;
  if (!bVar5) {
    return (from_chars_result)fVar3;
  }
  ptVar8 = this->stream;
  ptVar11 = (ptVar8->tokens).
            super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
            _M_impl.super__Vector_impl_data._M_start;
  tVar1 = ptVar11[ptVar8->current].type;
  sVar7 = ptVar8->current + 1;
  ptVar8->current = sVar7;
  if (tVar1 != dot) {
LAB_0015e28b:
    fVar4._8_8_ = 0x16;
    fVar4.ptr = ptVar11[sVar7 - 1].lexeme;
    return (from_chars_result)fVar4;
  }
  sVar7 = ptVar8->current;
  ptVar15 = (ptVar8->tokens).
            super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ptVar11 = ptVar15 + sVar7;
  local_38.type = ptVar11->type;
  local_38.value.
  super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
       = (ptVar11->value).
         super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>;
  local_38._3_5_ = *(undefined5 *)&ptVar11->field_0x3;
  pcVar9 = ptVar15[sVar7].lexeme;
  ptVar8->current = sVar7 + 1;
  local_38.lexeme = pcVar9;
  if (local_38.type != digit) {
    uVar10 = 0x16;
    bVar5 = false;
    goto LAB_0015e2de;
  }
  pbVar6 = std::get<1UL,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                     (&local_38.value);
  uVar16 = (ulong)*pbVar6;
  if (uVar16 == 0) {
    out->patch_ = (uint)*pbVar6;
    ptVar8 = this->stream;
LAB_0015e2b7:
    ptVar14 = (ptVar8->tokens).
              super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
              _M_impl.super__Vector_impl_data._M_start + ptVar8->current;
    uVar10 = 0;
    bVar5 = true;
  }
  else {
    ptVar8 = this->stream;
    sVar7 = ptVar8->current;
    ptVar15 = (ptVar8->tokens).
              super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ptVar11 = ptVar15 + sVar7;
    uVar10._0_1_ = ptVar11->type;
    uVar10._1_2_ = (ptVar11->value).
                   super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
    ;
    uVar10._3_5_ = *(undefined5 *)&ptVar11->field_0x3;
    if ((token_type)uVar10 == digit) {
      ptVar15 = ptVar15 + sVar7;
      do {
        local_38.lexeme = ptVar15->lexeme;
        ptVar8->current = sVar7 + 1;
        local_38._0_8_ = uVar10;
        pbVar6 = std::get<1UL,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                           (&local_38.value);
        uVar16 = (ulong)*pbVar6 + uVar16 * 10;
        ptVar8 = this->stream;
        sVar7 = ptVar8->current;
        ptVar11 = (ptVar8->tokens).
                  super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ptVar15 = ptVar11 + sVar7;
        ptVar11 = ptVar11 + sVar7;
        uVar10._0_1_ = ptVar11->type;
        uVar10._1_2_ = (ptVar11->value).
                       super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
        ;
        uVar10._3_5_ = *(undefined5 *)&ptVar11->field_0x3;
      } while ((token_type)uVar10 == digit);
    }
    if (uVar16 < 0x80000000) {
      out->patch_ = (int)uVar16;
      goto LAB_0015e2b7;
    }
    uVar10 = 0x22;
    bVar5 = false;
  }
  pcVar9 = ptVar14->lexeme;
LAB_0015e2de:
  fVar17._8_8_ = uVar10;
  fVar17.ptr = pcVar9;
  if (bVar5) {
    ptVar8 = this->stream;
    if ((ptVar8->tokens).
        super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
        super__Vector_impl_data._M_start[ptVar8->current].type == hyphen) {
      ptVar8->current = ptVar8->current + 1;
      fVar17 = (from_chars_result)
               parse_prerelease_tag(this,&out->prerelease_tag_,&out->prerelease_identifiers);
      if (fVar17.ec != 0) {
        return (from_chars_result)fVar17;
      }
    }
    ptVar8 = this->stream;
    if ((ptVar8->tokens).
        super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
        super__Vector_impl_data._M_start[ptVar8->current].type == plus) {
      ptVar8->current = ptVar8->current + 1;
      fVar17 = (from_chars_result)parse_build_metadata(this,&out->build_metadata_);
    }
  }
  return (from_chars_result)fVar17;
}

Assistant:

SEMVER_CONSTEXPR from_chars_result parse(version<I1, I2, I3>& out) noexcept {
    out.clear();

    from_chars_result result = parse_number(out.major_); 
    if (!result) {
      return result;
    }

    if (!stream.consume(token_type::dot)) {
      return failure(stream.previous().lexeme);
    }

    result = parse_number(out.minor_);
    if (!result) {
      return result;
    }

    if (!stream.consume(token_type::dot)) {
      return failure(stream.previous().lexeme);
    }

    result = parse_number(out.patch_);
    if (!result) {
      return result;
    }

    if (stream.advanceIfMatch(token_type::hyphen)) {
      result = parse_prerelease_tag(out.prerelease_tag_, out.prerelease_identifiers);
      if (!result) {
        return result;
      }
    }

    if (stream.advanceIfMatch(token_type::plus)) {
      result = parse_build_metadata(out.build_metadata_);
      if (!result) {
        return result;
      }
    }

    return result;
  }